

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinPKZB_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double vtb;
  double vta;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double vlb;
  double vla;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  long local_80;
  const_host_buffer_type local_78;
  const_host_buffer_type local_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  if (0 < N) {
    lVar4 = (ulong)(uint)N << 3;
    lVar5 = 2;
    lVar6 = 0;
    dVar12 = scal_fact;
    dVar11 = scal_fact;
    local_80 = lVar4;
    local_78 = sigma;
    local_70 = rho;
    local_58 = scal_fact;
    dStack_50 = scal_fact;
    local_48 = scal_fact;
    do {
      auVar8 = *(undefined1 (*) [16])((long)rho + lVar6 * 2);
      local_88 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      local_a0 = 0.0;
      local_a8 = 0.0;
      local_b0 = 0.0;
      local_60 = 0.0;
      local_68 = 0.0;
      local_b8 = 0.0;
      local_c0 = 0.0;
      if (1e-15 < auVar8._8_8_ + auVar8._0_8_) {
        auVar10._8_8_ = sigma[lVar5];
        auVar10._0_8_ = sigma[lVar5 + -2];
        auVar10 = maxpd(_DAT_0103b610,auVar10);
        auVar8 = maxpd(_DAT_0103b3b0,auVar8);
        auVar13 = maxpd(_DAT_0103b620,*(undefined1 (*) [16])((long)tau + lVar6 * 2));
        auVar9._0_8_ = auVar8._0_8_ * 8.0 * auVar13._0_8_;
        auVar9._8_8_ = auVar8._8_8_ * 8.0 * auVar13._8_8_;
        auVar10 = minpd(auVar9,auVar10);
        dVar11 = (auVar10._8_8_ + auVar10._0_8_) * 0.5;
        uVar7 = -(ulong)(-dVar11 <= sigma[lVar5 + -1]);
        dVar12 = (double)(uVar7 & (ulong)sigma[lVar5 + -1] | ~uVar7 & (ulong)-dVar11);
        uVar7 = -(ulong)(dVar12 <= dVar11);
        kernel_traits<ExchCXX::BuiltinPKZB_X>::eval_exc_vxc_polar_impl
                  (auVar8._0_8_,auVar8._8_8_,auVar10._0_8_,
                   (double)(~uVar7 & (ulong)dVar11 | uVar7 & (ulong)dVar12),auVar10._8_8_,0.0,0.0,
                   auVar13._0_8_,auVar13._8_8_,&local_88,&local_90,&local_98,&local_a0,&local_a8,
                   &local_b0,&local_60,&local_68,&local_b8,&local_c0);
        sigma = local_78;
        rho = local_70;
        lVar4 = local_80;
        scal_fact = local_48;
        dVar12 = local_58;
        dVar11 = dStack_50;
      }
      *(double *)((long)eps + lVar6) = local_88 * scal_fact + *(double *)((long)eps + lVar6);
      pdVar1 = (double *)((long)vrho + lVar6 * 2);
      dVar3 = pdVar1[1];
      pdVar2 = (double *)((long)vrho + lVar6 * 2);
      *pdVar2 = local_90 * dVar12 + *pdVar1;
      pdVar2[1] = local_98 * dVar11 + dVar3;
      dVar3 = (vsigma + lVar5 + -2)[1];
      vsigma[lVar5 + -2] = local_a0 * dVar12 + vsigma[lVar5 + -2];
      (vsigma + lVar5 + -2)[1] = local_a8 * dVar11 + dVar3;
      vsigma[lVar5] = local_b0 * scal_fact + vsigma[lVar5];
      pdVar1 = (double *)((long)vtau + lVar6 * 2);
      dVar3 = pdVar1[1];
      pdVar2 = (double *)((long)vtau + lVar6 * 2);
      *pdVar2 = local_b8 * dVar12 + *pdVar1;
      pdVar2[1] = local_c0 * dVar11 + dVar3;
      lVar5 = lVar5 + 3;
      lVar6 = lVar6 + 8;
    } while (lVar4 != lVar6);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;

    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double e, vra, vrb, vsaa,vsab,vsbb, vla, vlb, vta, vtb;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      e, vra, vrb, vsaa, vsab, vsbb, vla, vlb, vta, vtb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;
    vtau_i[0]   += scal_fact * vta;
    vtau_i[1]   += scal_fact * vtb;
    if(traits::needs_laplacian) {
      vlapl_i[0] += scal_fact * vla;
      vlapl_i[1] += scal_fact * vlb;
    }

  }

}